

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_node_t mpack_tree_root(mpack_tree_t *tree)

{
  mpack_error_t mVar1;
  mpack_tree_t *tree_local;
  
  mVar1 = mpack_tree_error(tree);
  if (mVar1 == mpack_ok) {
    if ((tree->parsed & 1U) == 0) {
      mpack_tree_flag_error(tree,mpack_error_bug);
      _tree_local = mpack_tree_nil_node(tree);
    }
    else {
      _tree_local = mpack_node(tree,tree->root);
    }
  }
  else {
    _tree_local = mpack_tree_nil_node(tree);
  }
  return _tree_local;
}

Assistant:

mpack_node_t mpack_tree_root(mpack_tree_t* tree) {
    if (mpack_tree_error(tree) != mpack_ok)
        return mpack_tree_nil_node(tree);

    // We check that mpack_tree_parse() was called at least once, and
    // assert if not. This is to facilitate the transition to requiring
    // a call to mpack_tree_parse(), since it used to be automatic on
    // initialization.
    if (!tree->parsed) {
        mpack_break("Tree has not been parsed! You must call mpack_tree_parse()"
                " after initialization before accessing the root node.");
        mpack_tree_flag_error(tree, mpack_error_bug);
        return mpack_tree_nil_node(tree);
    }

    return mpack_node(tree, tree->root);
}